

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O1

void write_random_seed(void *data,int len)

{
  bool bVar1;
  int __fd;
  char *__file;
  ssize_t sVar2;
  int *piVar3;
  char *pcVar4;
  char *ptr;
  uint uVar5;
  int iVar6;
  ulong __n;
  
  __n = (ulong)(uint)len;
  __file = make_filename(3,(char *)0x0);
  __fd = open(__file,0x41,0x180);
  if (__fd < 0) {
    piVar3 = __errno_location();
    if (*piVar3 != 2) {
      pcVar4 = strerror(*piVar3);
      nonfatal("Unable to write random seed: open(\"%s\") returned \'%s\'",__file,pcVar4);
      goto LAB_00142b4b;
    }
    pcVar4 = make_filename(0,(char *)0x0);
    ptr = make_dir_path(pcVar4,0x1c0);
    if (ptr == (char *)0x0) {
      safefree(pcVar4);
      __fd = open(__file,0x41,0x180);
      bVar1 = true;
      if (__fd < 0) {
        pcVar4 = strerror(*piVar3);
        nonfatal("Unable to write random seed: open(\"%s\") returned \'%s\'",__file,pcVar4);
        pcVar4 = __file;
        goto LAB_00142b29;
      }
    }
    else {
      nonfatal("Unable to write random seed: %s",ptr);
      safefree(ptr);
      safefree(__file);
LAB_00142b29:
      safefree(pcVar4);
      bVar1 = false;
    }
    if (!bVar1) {
      return;
    }
  }
  do {
    if ((int)__n < 1) break;
    sVar2 = write(__fd,data,__n);
    iVar6 = (int)sVar2;
    if (iVar6 < 0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      nonfatal("Unable to write random seed: write returned \'%s\'",pcVar4);
    }
    else {
      uVar5 = (int)__n - iVar6;
      __n = (ulong)uVar5;
      data = (void *)((long)data + (long)(int)uVar5);
    }
  } while (-1 < iVar6);
  close(__fd);
LAB_00142b4b:
  safefree(__file);
  return;
}

Assistant:

void write_random_seed(void *data, int len)
{
    int fd;
    char *fname;

    fname = make_filename(INDEX_RANDSEED, NULL);
    /*
     * Don't truncate the random seed file if it already exists; if
     * something goes wrong half way through writing it, it would
     * be better to leave the old data there than to leave it empty.
     */
    fd = open(fname, O_CREAT | O_WRONLY, 0600);
    if (fd < 0) {
        if (errno != ENOENT) {
            nonfatal("Unable to write random seed: open(\"%s\") "
                     "returned '%s'", fname, strerror(errno));
            sfree(fname);
            return;
        }
        char *dir, *errmsg;

        dir = make_filename(INDEX_DIR, NULL);
        if ((errmsg = make_dir_path(dir, 0700)) != NULL) {
            nonfatal("Unable to write random seed: %s", errmsg);
            sfree(errmsg);
            sfree(fname);
            sfree(dir);
            return;
        }
        sfree(dir);

        fd = open(fname, O_CREAT | O_WRONLY, 0600);
        if (fd < 0) {
            nonfatal("Unable to write random seed: open(\"%s\") "
                     "returned '%s'", fname, strerror(errno));
            sfree(fname);
            return;
        }
    }

    while (len > 0) {
        int ret = write(fd, data, len);
        if (ret < 0) {
            nonfatal("Unable to write random seed: write "
                     "returned '%s'", strerror(errno));
            break;
        }
        len -= ret;
        data = (char *)data + len;
    }

    close(fd);
    sfree(fname);
}